

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.c
# Opt level: O3

int chacha20_setup_crypto(ptls_cipher_context_t *_ctx,int is_enc,void *key)

{
  _ctx->do_dispose = chacha20_dispose;
  _ctx->do_init = chacha20_init;
  _ctx->do_transform = chacha20_transform;
  cf_chacha20_init((cf_chacha20_ctx *)(_ctx + 1),(uint8_t *)key,0x20,(uint8_t *)"01234567");
  return 0;
}

Assistant:

static int chacha20_setup_crypto(ptls_cipher_context_t *_ctx, int is_enc, const void *key)
{
    struct chacha20_context_t *ctx = (struct chacha20_context_t *)_ctx;
    ctx->super.do_dispose = chacha20_dispose;
    ctx->super.do_init = chacha20_init;
    ctx->super.do_transform = chacha20_transform;
    cf_chacha20_init(&ctx->chacha, key, PTLS_CHACHA20_KEY_SIZE, (const uint8_t *)"01234567" /* not used */);
    return 0;
}